

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initest.c
# Opt level: O3

void ma_inn(double *inp,int N,int q,double *theta,int lag)

{
  size_t __size;
  double *theta_00;
  double *v;
  ulong uVar1;
  
  __size = (long)lag * 8 + 8;
  theta_00 = (double *)malloc(((long)lag + 1) * __size);
  v = (double *)malloc(__size);
  innalg(inp,N,lag,v,theta_00);
  if (0 < q) {
    uVar1 = 0;
    do {
      theta[uVar1] = -theta_00[(long)((lag + 1) * lag) + uVar1 + 1];
      uVar1 = uVar1 + 1;
    } while ((uint)q != uVar1);
  }
  free(v);
  free(theta_00);
  return;
}

Assistant:

void ma_inn(double *inp, int N,int q, double* theta, int lag) {

	// Moving Average Parameters for a MA(q) process using Innovations
	// Algorithm. lag is typically set at <= 17
	int i;
	double *v,*thetap;

	thetap = (double*) malloc(sizeof(double) * (lag+1) * (lag+1));
	v = (double*) malloc(sizeof(double) * (lag+1));
	innalg(inp,N,lag,v,thetap);
	for(i = 0; i < q; ++i) {
		theta[i] = -thetap[lag*(lag+1) + 1 + i];
	}

	free(v);
	free(thetap);
}